

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-print.cc
# Opt level: O1

void __thiscall IR::Print::visit(Print *this,CJump *cj)

{
  BasicBlock *pBVar1;
  basic_ostream<char,_std::char_traits<char>_> *os;
  long lVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  BasicBlock *pBVar6;
  long lVar7;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  args_02;
  string name;
  string binop;
  string unop;
  pointer local_d8;
  size_type sStack_d0;
  char local_c8;
  undefined7 uStack_c7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  BasicBlock *local_78;
  BasicBlock *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  char *pcStack_60;
  pointer local_58;
  size_type sStack_50;
  ulong local_48;
  long lVar5;
  
  pBVar1 = (cj->super_tuple<const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>).
           super__Tuple_impl<0UL,_const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>.
           super__Tuple_impl<1UL,_IR::BasicBlock_*,_IR::BasicBlock_*>.
           super__Tuple_impl<2UL,_IR::BasicBlock_*>.super__Head_base<2UL,_IR::BasicBlock_*,_false>.
           _M_head_impl;
  pBVar6 = (cj->super_tuple<const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>).
           super__Tuple_impl<0UL,_const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>.
           super__Tuple_impl<1UL,_IR::BasicBlock_*,_IR::BasicBlock_*>.
           super__Head_base<1UL,_IR::BasicBlock_*,_false>._M_head_impl;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"==","");
  local_70 = pBVar1;
  if (this->nextBlock_ ==
      (cj->super_tuple<const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>).
      super__Tuple_impl<0UL,_const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>.
      super__Tuple_impl<1UL,_IR::BasicBlock_*,_IR::BasicBlock_*>.
      super__Head_base<1UL,_IR::BasicBlock_*,_false>._M_head_impl) {
    std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)local_98._M_string_length,0x1294fe);
    std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)local_b8._M_string_length,0x129500);
    local_70 = pBVar6;
    pBVar6 = pBVar1;
  }
  iVar4 = (*((cj->super_tuple<const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>).
             super__Tuple_impl<0UL,_const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>.
             super__Head_base<0UL,_const_IR::Expr_*,_false>._M_head_impl)->_vptr_Expr[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  if (lVar5 == 0) {
    iVar4 = (*((cj->super_tuple<const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>).
               super__Tuple_impl<0UL,_const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>.
               super__Head_base<0UL,_const_IR::Expr_*,_false>._M_head_impl)->_vptr_Expr[5])();
    lVar5 = CONCAT44(extraout_var_00,iVar4);
    if (lVar5 == 0) {
      iVar4 = (*((cj->super_tuple<const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>).
                 super__Tuple_impl<0UL,_const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>.
                 super__Head_base<0UL,_const_IR::Expr_*,_false>._M_head_impl)->_vptr_Expr[6])();
      lVar5 = CONCAT44(extraout_var_01,iVar4);
      if (lVar5 == 0) {
        __assert_fail("!\"unreachable\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/pgen/ir-print.cc"
                      ,0x97,"virtual void IR::Print::visit(IR::CJump *)");
      }
      if (fLB::FLAGS_lines == '\x01') {
        cVar3 = (char)this->out;
        std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(ulong)*(uint *)(lVar5 + 8);
        local_58 = (fLS::FLAGS_input_abi_cxx11_->_M_dataplus)._M_p;
        sStack_50 = fLS::FLAGS_input_abi_cxx11_->_M_string_length;
        format_str_02.size_ = 0xf;
        format_str_02.data_ = "#line {0} \"{1}\"";
        args_02.field_1.values_ =
             (value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
              *)&local_68;
        args_02.desc_ = 0xd1;
        fmt::v7::vprint<char>(this->out,format_str_02,args_02);
        cVar3 = (char)this->out;
        std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
      }
      fmt::v7::print<char[35],std::__cxx11::string&,std::__cxx11::string_const&,int&,char>
                (this->out,(char (*) [35])"\tif (yytoken() {0} {1}) goto L{2};",&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar5 + 0x10)
                 ,&pBVar6->index);
      cVar3 = (char)this->out;
      std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
    else {
      if ((fLB::FLAGS_lines == '\x01') && (*(int *)(lVar5 + 8) != 1)) {
        cVar3 = (char)this->out;
        std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(ulong)*(uint *)(lVar5 + 8);
        local_58 = (fLS::FLAGS_input_abi_cxx11_->_M_dataplus)._M_p;
        sStack_50 = fLS::FLAGS_input_abi_cxx11_->_M_string_length;
        format_str_00.size_ = 0xf;
        format_str_00.data_ = "#line {0} \"{1}\"";
        args_00.field_1.values_ =
             (value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
              *)&local_68;
        args_00.desc_ = 0xd1;
        fmt::v7::vprint<char>(this->out,format_str_00,args_00);
        cVar3 = (char)this->out;
        std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
      }
      fmt::v7::print<char[60],std::__cxx11::string&,std::__cxx11::string_const&,int&,char>
                (this->out,
                 (char (*) [60])"\tif ({0}([&]() -> bool {{{1} return true; }})()) goto L{2};",
                 &local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar5 + 0x10)
                 ,&pBVar6->index);
      cVar3 = (char)this->out;
      std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
  }
  else {
    if (fLB::FLAGS_lines == '\x01') {
      cVar3 = (char)this->out;
      std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      fmt::v7::print<char[16],int&,std::__cxx11::string&,char>
                (this->out,(char (*) [16])"#line {0} \"{1}\"",(int *)(*(long *)(lVar5 + 8) + 0x48),
                 fLS::FLAGS_input_abi_cxx11_);
      cVar3 = (char)this->out;
      std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
    lVar5 = *(long *)(lVar5 + 8);
    os = this->out;
    if (*(char *)(lVar5 + 0x4c) == '\x01') {
      local_d8 = &local_c8;
      sStack_d0 = 0;
      local_c8 = '\0';
      local_78 = pBVar6;
      iVar4 = std::__cxx11::string::compare(fLS::FLAGS_token_type_abi_cxx11_);
      if (iVar4 != 0) {
        std::__cxx11::string::_M_assign((string *)&local_d8);
        std::__cxx11::string::append((char *)&local_d8);
      }
      std::__cxx11::string::append((char *)&local_d8);
      lVar2 = *(long *)(lVar5 + 0x10);
      if (lVar2 != 0) {
        lVar5 = *(long *)(lVar5 + 8);
        lVar7 = 0;
        do {
          toupper((int)*(char *)(lVar5 + lVar7));
          std::__cxx11::string::push_back((char)&local_d8);
          lVar7 = lVar7 + 1;
        } while (lVar2 != lVar7);
      }
      local_48 = (ulong)(uint)local_78->index;
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_b8._M_dataplus._M_p;
      pcStack_60 = (char *)local_b8._M_string_length;
      local_58 = local_d8;
      sStack_50 = sStack_d0;
      format_str.size_ = 0x22;
      format_str.data_ = "\tif (yytoken() {0} {1}) goto L{2};";
      args.field_1.values_ =
           (value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
            *)&local_68;
      args.desc_ = 0x1dd;
      fmt::v7::vprint<char>(os,format_str,args);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
      }
    }
    else {
      fmt::v7::
      print<char[35],std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string&,int&,char>
                (os,(char (*) [35])"\tif ({0}parse_{1}({2})) goto L{3};",&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar5 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar5 + 0x28)
                 ,&pBVar6->index);
    }
    cVar3 = (char)this->out;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  if (local_70 != this->nextBlock_) {
    local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(ulong)(uint)local_70->index;
    format_str_01.size_ = 0xb;
    format_str_01.data_ = "\tgoto L{0};";
    args_01.field_1.values_ =
         (value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
          *)&local_68;
    args_01.desc_ = 1;
    fmt::v7::vprint<char>(this->out,format_str_01,args_01);
    cVar3 = (char)this->out;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Print::visit(IR::CJump* cj) {
  IR::BasicBlock* target = cj->iftrue();
  IR::BasicBlock* cont = cj->iffalse();
  std::string unop = "";
  std::string binop = "==";

  if (nextBlock_ == cj->iftrue()) {
    std::swap(target, cont);
    unop = "!";
    binop = "!=";
  }

  if (auto name = cj->cond()->asName()) {
    if (FLAGS_lines) {
      out << std::endl;
      fmt::print(out, "#line {0} \"{1}\"", name->sym()->line, FLAGS_input);
      out << std::endl;
    }

    const auto& id = name->sym()->name;

    if (name->sym()->isTerminal) {
      fmt::print(out, "\tif (yytoken() {0} {1}) goto L{2};", binop,
                 tokenName(id), target->index);
    } else {
      fmt::print(out, "\tif ({0}parse_{1}({2})) goto L{3};", unop, id,
                 name->sym()->extra, target->index);
    }
    out << std::endl;
  } else if (auto code = cj->cond()->asCode()) {
    if (FLAGS_lines && code->line() != 1) {
      out << std::endl;
      fmt::print(out, "#line {0} \"{1}\"", code->line(), FLAGS_input);
      out << std::endl;
    }

    fmt::print(out,
               "\tif ({0}([&]() -> bool {{{1} return true; }})()) goto L{2};",
               unop, code->text(), target->index);

    out << std::endl;
  } else if (auto literal = cj->cond()->asCharLiteral()) {
    if (FLAGS_lines) {
      out << std::endl;
      fmt::print(out, "#line {0} \"{1}\"", literal->line(), FLAGS_input);
      out << std::endl;
    }

    fmt::print(out, "\tif (yytoken() {0} {1}) goto L{2};", binop,
               literal->value(), target->index);

    out << std::endl;
  } else {
    assert(!"unreachable");
  }

  if (cont != nextBlock_) {
    fmt::print(out, "\tgoto L{0};", cont->index);
    out << std::endl;
  }
}